

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::BasicCopyTexSubImageCubeCase::createTexture
          (BasicCopyTexSubImageCubeCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 type;
  byte bVar3;
  int iVar4;
  uint uVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  Context *pCVar9;
  NotSupportedError *this_01;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ChannelOrder CVar13;
  bool bVar14;
  int face;
  long lVar15;
  int iVar16;
  uint uVar17;
  int ndx;
  long lVar18;
  float fVar19;
  uint local_258;
  deUint32 tex;
  ulong local_238;
  ulong local_230;
  Vec4 colorB;
  Vec4 colorA;
  TextureFormat fmt;
  Random rnd;
  PixelBufferAccess local_1e8;
  TextureLevel data;
  float local_198 [4];
  GradientShader shader;
  
  iVar4 = (*((this->super_TextureSpecCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[4])();
  lVar15 = CONCAT44(extraout_var,iVar4);
  bVar14 = false;
  if ((0 < *(int *)(lVar15 + 8)) && (0 < *(int *)(lVar15 + 0xc))) {
    bVar14 = 0 < *(int *)(lVar15 + 0x10);
  }
  iVar4 = *(int *)(lVar15 + 0x14);
  fmt = (this->super_TextureSpecCase).m_texFormat;
  CVar13 = fmt.order;
  bVar3 = (byte)fmt.order;
  local_258 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar10 = (this->super_TextureSpecCase).m_width;
    uVar5 = 0x20;
    uVar12 = 0x20;
    if (uVar10 != 0) {
      uVar12 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      uVar12 = uVar12 ^ 0x1f;
    }
    uVar10 = (this->super_TextureSpecCase).m_height;
    if (uVar10 != 0) {
      uVar5 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = uVar5 ^ 0x1f;
    }
    iVar16 = 0x1f - uVar5;
    if ((int)(0x1f - uVar5) < (int)(0x1f - uVar12)) {
      iVar16 = 0x1f - uVar12;
    }
    local_258 = iVar16 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar6 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar6);
  GradientShader::GradientShader(&shader);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar6 = (*pCVar9->_vptr_Context[0x75])(pCVar9,&shader);
  if ((CVar13 == A || bVar14) &&
     ((RGBA < CVar13 || (0xedU >> (bVar3 & 0x1f) & 1) != 0) || 0 < iVar4)) {
    sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
    if (local_258 != 0) {
      uVar11 = 0;
      do {
        iVar4 = (this->super_TextureSpecCase).m_width >> ((byte)uVar11 & 0x1f);
        if (iVar4 < 2) {
          iVar4 = 1;
        }
        iVar16 = (this->super_TextureSpecCase).m_height >> ((byte)uVar11 & 0x1f);
        if (iVar16 < 2) {
          iVar16 = 1;
        }
        local_238 = CONCAT44(local_238._4_4_,iVar4);
        local_230 = uVar11;
        tcu::TextureLevel::setSize(&data,iVar4,iVar16,1);
        lVar15 = 0;
        do {
          local_1e8.super_ConstPixelBufferAccess.m_format.order = R;
          local_1e8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
          local_1e8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
          local_1e8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
          colorB.m_data[0] = 1.0;
          colorB.m_data[1] = 1.0;
          colorB.m_data[2] = 1.0;
          colorB.m_data[3] = 1.0;
          colorA.m_data[0] = 0.0;
          colorA.m_data[1] = 0.0;
          colorA.m_data[2] = 0.0;
          colorA.m_data[3] = 0.0;
          lVar18 = 0;
          do {
            fVar1 = (float)local_1e8.super_ConstPixelBufferAccess.m_size.m_data[lVar18 + -2];
            fVar2 = colorB.m_data[lVar18];
            fVar19 = deRandom_getFloat(&rnd.m_rnd);
            colorA.m_data[lVar18] = (fVar2 - fVar1) * fVar19 + fVar1;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          local_1e8.super_ConstPixelBufferAccess.m_format.order = R;
          local_1e8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
          local_1e8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
          local_1e8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
          local_198[0] = 1.0;
          local_198[1] = 1.0;
          local_198[2] = 1.0;
          local_198[3] = 1.0;
          colorB.m_data[0] = 0.0;
          colorB.m_data[1] = 0.0;
          colorB.m_data[2] = 0.0;
          colorB.m_data[3] = 0.0;
          lVar18 = 0;
          do {
            fVar1 = (float)local_1e8.super_ConstPixelBufferAccess.m_size.m_data[lVar18 + -2];
            fVar2 = local_198[lVar18];
            fVar19 = deRandom_getFloat(&rnd.m_rnd);
            colorB.m_data[lVar18] = (fVar2 - fVar1) * fVar19 + fVar1;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          dVar7 = deRandom_getUint32(&rnd.m_rnd);
          tcu::TextureLevel::getAccess(&local_1e8,&data);
          tcu::fillWithGrid(&local_1e8,dVar7 % 0xf + 2,&colorA,&colorB);
          dVar7 = (&s_cubeMapFaces)[lVar15];
          dVar8 = this->m_format;
          type = this->m_dataType;
          tcu::TextureLevel::getAccess(&local_1e8,&data);
          sglr::ContextWrapper::glTexImage2D
                    (this_00,dVar7,(int)local_230,dVar8,(int)local_238,iVar16,0,dVar8,type,
                     local_1e8.super_ConstPixelBufferAccess.m_data);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 6);
        uVar10 = (int)local_230 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != local_258);
    }
    pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_1e8.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
    local_1e8.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
    local_1e8.super_ConstPixelBufferAccess.m_size.m_data._0_8_ =
         local_1e8.super_ConstPixelBufferAccess.m_size.m_data._0_8_ & 0xffffffff00000000;
    colorA.m_data[0] = 1.0;
    colorA.m_data[1] = 1.0;
    colorA.m_data._8_8_ = colorA.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar9,dVar6,(Vec3 *)&local_1e8,(Vec3 *)&colorA);
    if (local_258 != 0) {
      uVar11 = 0;
      do {
        uVar10 = (this->super_TextureSpecCase).m_width >> ((byte)uVar11 & 0x1f);
        if ((int)uVar10 < 2) {
          uVar10 = 1;
        }
        uVar12 = (this->super_TextureSpecCase).m_height >> ((byte)uVar11 & 0x1f);
        if ((int)uVar12 < 2) {
          uVar12 = 1;
        }
        lVar15 = 0;
        local_238 = uVar11;
        do {
          dVar6 = deRandom_getUint32(&rnd.m_rnd);
          uVar5 = dVar6 % uVar10;
          dVar6 = deRandom_getUint32(&rnd.m_rnd);
          uVar17 = dVar6 % uVar12;
          dVar6 = deRandom_getUint32(&rnd.m_rnd);
          dVar7 = deRandom_getUint32(&rnd.m_rnd);
          local_230 = CONCAT44(local_230._4_4_,dVar7 % (uVar12 - uVar17));
          iVar4 = sglr::ContextWrapper::getWidth(this_00);
          dVar7 = deRandom_getUint32(&rnd.m_rnd);
          iVar16 = sglr::ContextWrapper::getHeight(this_00);
          dVar8 = deRandom_getUint32(&rnd.m_rnd);
          sglr::ContextWrapper::glCopyTexSubImage2D
                    (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar15),(int)local_238,
                     dVar6 % (uVar10 - uVar5),(int)local_230,dVar7 % (iVar4 - uVar5),
                     dVar8 % (iVar16 - uVar17),uVar5 + 1,uVar17 + 1);
          lVar15 = lVar15 + 4;
        } while (lVar15 != 0x18);
        uVar10 = (int)local_238 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != local_258);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    tcu::TextureLevel::~TextureLevel(&data);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported",
             ::glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x5c0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= m_texFormat;
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		int							numLevels		= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32					tex				= 0;
		tcu::TextureLevel			data			(fmt);
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader;
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			data.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4	colorA		= randomVector<4>(rnd);
				Vec4	colorB		= randomVector<4>(rnd);
				int		cellSize	= rnd.getInt(2, 16);

				tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}

		// Fill render target with gradient.
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		// Re-specify parts of each face and level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int		w			= rnd.getInt(1, levelW);
				int		h			= rnd.getInt(1, levelH);
				int		xo			= rnd.getInt(0, levelW-w);
				int		yo			= rnd.getInt(0, levelH-h);

				int		x			= rnd.getInt(0, getWidth() - w);
				int		y			= rnd.getInt(0, getHeight() - h);

				glCopyTexSubImage2D(s_cubeMapFaces[face], ndx, xo, yo, x, y, w, h);
			}
		}
	}